

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::rasterization::anon_unknown_0::TriangleInterpolationTestCase::createInstance
          (TriangleInterpolationTestCase *this,Context *context)

{
  TriangleInterpolationTestInstance *this_00;
  Context *context_local;
  TriangleInterpolationTestCase *this_local;
  
  this_00 = (TriangleInterpolationTestInstance *)operator_new(0x298);
  TriangleInterpolationTestInstance::TriangleInterpolationTestInstance
            (this_00,context,this->m_primitiveTopology,this->m_flags,
             (this->super_BaseRenderingTestCase).m_sampleCount);
  return (TestInstance *)this_00;
}

Assistant:

virtual TestInstance*		createInstance					(Context& context) const
								{
									return new TriangleInterpolationTestInstance(context, m_primitiveTopology, m_flags, m_sampleCount);
								}